

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O3

void __thiscall
jhu::thrax::PhraseTests_RemoveIndices_Test::TestBody(PhraseTests_RemoveIndices_Test *this)

{
  bool bVar1;
  long lVar2;
  ushort *puVar3;
  void *__dest;
  ushort *puVar4;
  ulong uVar5;
  ushort *puVar6;
  short *psVar7;
  ulong uVar8;
  difference_type __d;
  char *pcVar9;
  ulong uVar10;
  AssertionResult gtest_ar;
  Indices is;
  Span s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Indices local_30;
  Span local_14;
  
  local_14.start = 0;
  local_14.end = 3;
  Span::indices(&local_30,&local_14);
  lVar2 = (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar5 = lVar2 >> 1;
  puVar3 = (ushort *)
           local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (ushort *)
           local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = uVar5;
  if (0 < (long)uVar5) {
    do {
      uVar10 = ~(uVar8 >> 1) + uVar8;
      psVar7 = (short *)((uVar8 & 0xfffffffffffffffe) + (long)puVar4);
      puVar3 = (ushort *)(psVar7 + 1);
      if (-1 < *psVar7) {
        uVar10 = uVar8 >> 1;
        puVar3 = puVar4;
      }
      puVar4 = puVar3;
      uVar8 = uVar10;
      puVar6 = (ushort *)
               local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (0 < (long)uVar10);
    do {
      uVar8 = uVar5 >> 1;
      psVar7 = (short *)((uVar5 & 0xfffffffffffffffe) + (long)puVar6);
      puVar4 = (ushort *)(psVar7 + 1);
      uVar5 = ~uVar8 + uVar5;
      if (0 < *psVar7) {
        uVar5 = uVar8;
        puVar4 = puVar6;
      }
      puVar6 = puVar4;
    } while (0 < (long)uVar5);
  }
  puVar6 = (ushort *)
           local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != (ushort *)
                local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    puVar6 = puVar3 + (*puVar3 >> 0xf);
    lVar2 = (long)puVar6 -
            (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  if (puVar6 != puVar4) {
    __dest = (void *)((long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar2);
    puVar3 = puVar4;
    if ((long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar4 != 0) {
      memmove(__dest,puVar4,
              (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar4);
      puVar3 = (ushort *)
               local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    puVar4 = (ushort *)((long)__dest + ((long)puVar3 - (long)puVar4));
    if (puVar3 != puVar4) {
      local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)puVar4;
    }
  }
  local_48.data_._0_4_ = 2;
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
              super__Vector_impl_data._M_start >> 1);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_40,"2","is.size()",(int *)&local_48,(unsigned_long *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x6a,pcVar9);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (((local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_50.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.ptr_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,short>
              (local_40,"1","is.front()",(int *)&local_50,
               local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x6b,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.ptr_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,short>
              (local_40,"2","is.back()",(int *)&local_50,
               local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_finish + -1);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar9 = "";
      }
      else {
        pcVar9 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x6c,pcVar9);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((ushort *)
      local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (ushort *)0x0) {
    operator_delete(local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(PhraseTests, RemoveIndices) {
  Span s{0, 3};
  auto is = s.indices();
  removeIndices(is, {0, 1});
  ASSERT_EQ(2, is.size());
  EXPECT_EQ(1, is.front());
  EXPECT_EQ(2, is.back());
}